

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall spirv_cross::CompilerMSL::is_direct_input_builtin(CompilerMSL *this,BuiltIn bi_type)

{
  byte bVar1;
  ExecutionModel EVar2;
  uint uVar3;
  ulong uVar4;
  bool bVar5;
  
  bVar1 = 0;
  if (bi_type < (BuiltInSubgroupId|BuiltInCullDistance)) {
    uVar4 = (ulong)bi_type;
    if ((0x885800UL >> (uVar4 & 0x3f) & 1) != 0) goto LAB_002a8936;
    if ((0x21000000000U >> (uVar4 & 0x3f) & 1) != 0) {
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      bVar1 = 1;
      if (EVar2 == ExecutionModelGLCompute) goto LAB_002a8936;
      EVar2 = Compiler::get_execution_model((Compiler *)this);
      if (EVar2 == ExecutionModelFragment) {
        bVar1 = 0x4ee7 < (this->msl_options).msl_version;
        goto LAB_002a8936;
      }
LAB_002a8961:
      bVar1 = 0;
      goto LAB_002a8936;
    }
    if ((0xc0000000000U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_002a884b;
LAB_002a88dc:
    EVar2 = Compiler::get_execution_model((Compiler *)this);
    bVar5 = EVar2 != ExecutionModelVertex;
    bVar1 = (this->msl_options).vertex_for_tessellation;
  }
  else {
LAB_002a884b:
    uVar3 = bi_type - BuiltInSubgroupEqMask;
    if (uVar3 < 0x19) {
      if ((0x40001fU >> (uVar3 & 0x1f) & 1) != 0) goto LAB_002a8936;
      if ((0x300U >> (uVar3 & 0x1f) & 1) != 0) goto LAB_002a88dc;
      if (uVar3 == 0x18) {
        EVar2 = Compiler::get_execution_model((Compiler *)this);
        if ((EVar2 == ExecutionModelFragment) && ((this->msl_options).multiview == true)) {
          bVar1 = (this->msl_options).multiview_layered_rendering;
          goto LAB_002a8936;
        }
        goto LAB_002a8961;
      }
    }
    if (((bi_type < 2) || (bi_type - BuiltInClipDistance < 2)) || (bi_type - BuiltInBaryCoordNV < 2)
       ) goto LAB_002a8936;
    if (1 < bi_type - BuiltInPrimitiveId) {
      if (1 < bi_type - BuiltInVertexId) {
        bVar1 = 1;
        goto LAB_002a8936;
      }
      goto LAB_002a88dc;
    }
    EVar2 = Compiler::get_execution_model((Compiler *)this);
    bVar5 = EVar2 != ExecutionModelTessellationControl;
    bVar1 = (this->msl_options).multi_patch_workgroup;
  }
  bVar1 = bVar1 ^ 1 | bVar5;
LAB_002a8936:
  return (bool)(bVar1 & 1);
}

Assistant:

bool CompilerMSL::is_direct_input_builtin(BuiltIn bi_type)
{
	switch (bi_type)
	{
	// Vertex function in
	case BuiltInVertexId:
	case BuiltInVertexIndex:
	case BuiltInBaseVertex:
	case BuiltInInstanceId:
	case BuiltInInstanceIndex:
	case BuiltInBaseInstance:
		return get_execution_model() != ExecutionModelVertex || !msl_options.vertex_for_tessellation;
	// Tess. control function in
	case BuiltInPosition:
	case BuiltInPointSize:
	case BuiltInClipDistance:
	case BuiltInCullDistance:
	case BuiltInPatchVertices:
		return false;
	case BuiltInInvocationId:
	case BuiltInPrimitiveId:
		return get_execution_model() != ExecutionModelTessellationControl || !msl_options.multi_patch_workgroup;
	// Tess. evaluation function in
	case BuiltInTessLevelInner:
	case BuiltInTessLevelOuter:
		return false;
	// Fragment function in
	case BuiltInSamplePosition:
	case BuiltInHelperInvocation:
	case BuiltInBaryCoordNV:
	case BuiltInBaryCoordNoPerspNV:
		return false;
	case BuiltInViewIndex:
		return get_execution_model() == ExecutionModelFragment && msl_options.multiview &&
		       msl_options.multiview_layered_rendering;
	// Any stage function in
	case BuiltInDeviceIndex:
	case BuiltInSubgroupEqMask:
	case BuiltInSubgroupGeMask:
	case BuiltInSubgroupGtMask:
	case BuiltInSubgroupLeMask:
	case BuiltInSubgroupLtMask:
		return false;
	case BuiltInSubgroupLocalInvocationId:
	case BuiltInSubgroupSize:
		return get_execution_model() == ExecutionModelGLCompute ||
		       (get_execution_model() == ExecutionModelFragment && msl_options.supports_msl_version(2, 2));
	default:
		return true;
	}
}